

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::NetworkAddressImpl> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Array<kj::(anonymous_namespace)::SocketAddress>::~Array
              ((Array<kj::(anonymous_namespace)::SocketAddress> *)((long)pointer + 0x18));
  }
  operator_delete(pointer,0x38);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }